

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob.cc
# Opt level: O0

unique_ptr<QPDF,_std::default_delete<QPDF>_> __thiscall QPDFJob::createQPDF(QPDFJob *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar1;
  element_type *peVar2;
  element_type *filename;
  element_type *password;
  QPDFObjectHandle *oh;
  ulong uVar3;
  reference this_01;
  pointer this_02;
  __shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false> *in_RSI;
  unique_ptr<QPDF,_std::default_delete<QPDF>_> *foreign;
  iterator __end1;
  iterator __begin1;
  vector<std::unique_ptr<QPDF,_std::default_delete<QPDF>_>,_std::allocator<std::unique_ptr<QPDF,_std::default_delete<QPDF>_>_>_>
  *__range1;
  string local_260;
  QPDFObjectHandle local_240;
  allocator<char> local_229;
  string local_228;
  QPDFObjectHandle local_208;
  allocator<char> local_1f1;
  string local_1f0;
  QPDFObjectHandle local_1d0;
  allocator<char> local_1b9;
  string local_1b8;
  QPDFObjectHandle local_198;
  allocator<char> local_181;
  string local_180;
  QPDFObjectHandle local_160;
  QPDFObjectHandle local_150;
  allocator<char> local_139;
  QPDFObjectHandle local_138 [2];
  undefined1 local_118 [8];
  QPDFObjectHandle info;
  string local_100;
  allocator<char> local_d9;
  string local_d8 [39];
  allocator<char> local_b1;
  string local_b0 [32];
  undefined1 local_90 [24];
  QPDFObjectHandle mod_date;
  QPDFObjectHandle trailer;
  vector<std::unique_ptr<QPDF,_std::default_delete<QPDF>_>,_std::allocator<std::unique_ptr<QPDF,_std::default_delete<QPDF>_>_>_>
  page_heap;
  QPDF *pdf;
  QPDFExc *e;
  unique_ptr<QPDF,_std::default_delete<QPDF>_> local_20;
  unique_ptr<QPDF,_std::default_delete<QPDF>_> pdf_sp;
  QPDFJob *this_local;
  
  checkConfiguration((QPDFJob *)in_RSI);
  std::unique_ptr<QPDF,std::default_delete<QPDF>>::unique_ptr<std::default_delete<QPDF>,void>
            ((unique_ptr<QPDF,std::default_delete<QPDF>> *)&local_20);
  peVar2 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->(in_RSI);
  filename = std::__shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>::get
                       (&(peVar2->infilename).super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>);
  peVar2 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->(in_RSI);
  password = std::__shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>::get
                       (&(peVar2->password).super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>);
  processFile((QPDFJob *)in_RSI,&local_20,filename,password,true,true);
  oh = (QPDFObjectHandle *)std::unique_ptr<QPDF,_std::default_delete<QPDF>_>::operator*(&local_20);
  bVar1 = QPDF::isEncrypted((QPDF *)oh);
  if (bVar1) {
    peVar2 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(in_RSI);
    peVar2->encryption_status = 1;
  }
  peVar2 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->(in_RSI);
  if (((peVar2->check_is_encrypted & 1U) == 0) &&
     (peVar2 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->(in_RSI), (peVar2->check_requires_password & 1U) == 0)) {
    std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              (in_RSI);
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      peVar2 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->(in_RSI);
      QPDF::updateFromJSON((QPDF *)oh,&peVar2->update_from_json);
    }
    std::
    vector<std::unique_ptr<QPDF,_std::default_delete<QPDF>_>,_std::allocator<std::unique_ptr<QPDF,_std::default_delete<QPDF>_>_>_>
    ::vector((vector<std::unique_ptr<QPDF,_std::default_delete<QPDF>_>,_std::allocator<std::unique_ptr<QPDF,_std::default_delete<QPDF>_>_>_>
              *)&trailer.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    peVar2 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(in_RSI);
    bVar1 = std::vector<QPDFJob::PageSpec,_std::allocator<QPDFJob::PageSpec>_>::empty
                      (&peVar2->page_specs);
    if (!bVar1) {
      handlePageSpecs((QPDFJob *)in_RSI,(QPDF *)oh,
                      (vector<std::unique_ptr<QPDF,_std::default_delete<QPDF>_>,_std::allocator<std::unique_ptr<QPDF,_std::default_delete<QPDF>_>_>_>
                       *)&trailer.super_BaseHandle.obj.
                          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    }
    peVar2 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(in_RSI);
    bVar1 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFJob::RotationSpec,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFJob::RotationSpec>_>_>
            ::empty(&peVar2->rotations);
    if (!bVar1) {
      handleRotations((QPDFJob *)in_RSI,(QPDF *)oh);
    }
    handleUnderOverlay((QPDFJob *)in_RSI,(QPDF *)oh);
    handleTransformations((QPDFJob *)in_RSI,(QPDF *)oh);
    peVar2 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(in_RSI);
    if ((peVar2->remove_info & 1U) != 0) {
      QPDF::getTrailer((QPDF *)&mod_date.super_BaseHandle.obj.
                                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_b0,"/Info",&local_b1);
      QPDFObjectHandle::getKey
                ((QPDFObjectHandle *)local_90,
                 (string *)
                 &mod_date.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_d8,"/ModDate",&local_d9);
      QPDFObjectHandle::getKeyIfDict((QPDFObjectHandle *)(local_90 + 0x10),(string *)local_90);
      std::__cxx11::string::~string(local_d8);
      std::allocator<char>::~allocator(&local_d9);
      QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_90);
      std::__cxx11::string::~string(local_b0);
      std::allocator<char>::~allocator(&local_b1);
      bVar1 = QPDFObjectHandle::isNull((QPDFObjectHandle *)(local_90 + 0x10));
      if (bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_100,"/Info",
                   (allocator<char> *)
                   ((long)&info.super_BaseHandle.obj.
                           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                           _M_pi + 7));
        QPDFObjectHandle::removeKey
                  ((QPDFObjectHandle *)
                   &mod_date.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                   &local_100);
        std::__cxx11::string::~string((string *)&local_100);
        std::allocator<char>::~allocator
                  ((allocator<char> *)
                   ((long)&info.super_BaseHandle.obj.
                           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                           _M_pi + 7));
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)local_138,"/Info",&local_139);
        QPDFObjectHandle::newDictionary();
        QPDF::makeIndirectObject((QPDF *)&local_150,oh);
        QPDFObjectHandle::replaceKeyAndGetNew
                  ((QPDFObjectHandle *)local_118,
                   (string *)
                   &mod_date.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount,local_138
                  );
        QPDFObjectHandle::~QPDFObjectHandle(&local_150);
        QPDFObjectHandle::~QPDFObjectHandle(&local_160);
        std::__cxx11::string::~string((string *)local_138);
        std::allocator<char>::~allocator(&local_139);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_180,"/ModDate",&local_181);
        QPDFObjectHandle::replaceKey
                  ((QPDFObjectHandle *)local_118,&local_180,(QPDFObjectHandle *)(local_90 + 0x10));
        std::__cxx11::string::~string((string *)&local_180);
        std::allocator<char>::~allocator(&local_181);
        QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_118);
      }
      QPDF::getRoot((QPDF *)&local_198);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1b8,"/Metadata",&local_1b9);
      QPDFObjectHandle::removeKey(&local_198,&local_1b8);
      std::__cxx11::string::~string((string *)&local_1b8);
      std::allocator<char>::~allocator(&local_1b9);
      QPDFObjectHandle::~QPDFObjectHandle(&local_198);
      QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)(local_90 + 0x10));
      QPDFObjectHandle::~QPDFObjectHandle
                ((QPDFObjectHandle *)
                 &mod_date.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    }
    peVar2 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(in_RSI);
    if ((peVar2->remove_metadata & 1U) != 0) {
      QPDF::getRoot((QPDF *)&local_1d0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1f0,"/Metadata",&local_1f1);
      QPDFObjectHandle::removeKey(&local_1d0,&local_1f0);
      std::__cxx11::string::~string((string *)&local_1f0);
      std::allocator<char>::~allocator(&local_1f1);
      QPDFObjectHandle::~QPDFObjectHandle(&local_1d0);
    }
    peVar2 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(in_RSI);
    if ((peVar2->remove_structure & 1U) != 0) {
      QPDF::getRoot((QPDF *)&local_208);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_228,"/StructTreeRoot",&local_229);
      QPDFObjectHandle::removeKey(&local_208,&local_228);
      std::__cxx11::string::~string((string *)&local_228);
      std::allocator<char>::~allocator(&local_229);
      QPDFObjectHandle::~QPDFObjectHandle(&local_208);
      QPDF::getRoot((QPDF *)&local_240);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_260,"/MarkInfo",(allocator<char> *)((long)&__range1 + 7));
      QPDFObjectHandle::removeKey(&local_240,&local_260);
      std::__cxx11::string::~string((string *)&local_260);
      std::allocator<char>::~allocator((allocator<char> *)((long)&__range1 + 7));
      QPDFObjectHandle::~QPDFObjectHandle(&local_240);
    }
    this_00 = &trailer.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    __end1 = std::
             vector<std::unique_ptr<QPDF,_std::default_delete<QPDF>_>,_std::allocator<std::unique_ptr<QPDF,_std::default_delete<QPDF>_>_>_>
             ::begin((vector<std::unique_ptr<QPDF,_std::default_delete<QPDF>_>,_std::allocator<std::unique_ptr<QPDF,_std::default_delete<QPDF>_>_>_>
                      *)this_00);
    foreign = (unique_ptr<QPDF,_std::default_delete<QPDF>_> *)
              std::
              vector<std::unique_ptr<QPDF,_std::default_delete<QPDF>_>,_std::allocator<std::unique_ptr<QPDF,_std::default_delete<QPDF>_>_>_>
              ::end((vector<std::unique_ptr<QPDF,_std::default_delete<QPDF>_>,_std::allocator<std::unique_ptr<QPDF,_std::default_delete<QPDF>_>_>_>
                     *)this_00);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<std::unique_ptr<QPDF,_std::default_delete<QPDF>_>_*,_std::vector<std::unique_ptr<QPDF,_std::default_delete<QPDF>_>,_std::allocator<std::unique_ptr<QPDF,_std::default_delete<QPDF>_>_>_>_>
                                       *)&foreign), bVar1) {
      this_01 = __gnu_cxx::
                __normal_iterator<std::unique_ptr<QPDF,_std::default_delete<QPDF>_>_*,_std::vector<std::unique_ptr<QPDF,_std::default_delete<QPDF>_>,_std::allocator<std::unique_ptr<QPDF,_std::default_delete<QPDF>_>_>_>_>
                ::operator*(&__end1);
      this_02 = std::unique_ptr<QPDF,_std::default_delete<QPDF>_>::operator->(this_01);
      bVar1 = QPDF::anyWarnings(this_02);
      if (bVar1) {
        peVar2 = std::
                 __shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->(in_RSI);
        peVar2->warnings = true;
      }
      __gnu_cxx::
      __normal_iterator<std::unique_ptr<QPDF,_std::default_delete<QPDF>_>_*,_std::vector<std::unique_ptr<QPDF,_std::default_delete<QPDF>_>,_std::allocator<std::unique_ptr<QPDF,_std::default_delete<QPDF>_>_>_>_>
      ::operator++(&__end1);
    }
    std::unique_ptr<QPDF,_std::default_delete<QPDF>_>::unique_ptr
              ((unique_ptr<QPDF,_std::default_delete<QPDF>_> *)this,&local_20);
    std::
    vector<std::unique_ptr<QPDF,_std::default_delete<QPDF>_>,_std::allocator<std::unique_ptr<QPDF,_std::default_delete<QPDF>_>_>_>
    ::~vector((vector<std::unique_ptr<QPDF,_std::default_delete<QPDF>_>,_std::allocator<std::unique_ptr<QPDF,_std::default_delete<QPDF>_>_>_>
               *)&trailer.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  else {
    std::unique_ptr<QPDF,std::default_delete<QPDF>>::unique_ptr<std::default_delete<QPDF>,void>
              ((unique_ptr<QPDF,std::default_delete<QPDF>> *)this,(nullptr_t)0x0);
  }
  std::unique_ptr<QPDF,_std::default_delete<QPDF>_>::~unique_ptr(&local_20);
  return (__uniq_ptr_data<QPDF,_std::default_delete<QPDF>,_true,_true>)
         (__uniq_ptr_data<QPDF,_std::default_delete<QPDF>,_true,_true>)this;
}

Assistant:

std::unique_ptr<QPDF>
QPDFJob::createQPDF()
{
    checkConfiguration();
    std::unique_ptr<QPDF> pdf_sp;
    try {
        processFile(pdf_sp, m->infilename.get(), m->password.get(), true, true);
    } catch (QPDFExc& e) {
        if (e.getErrorCode() == qpdf_e_password) {
            // Allow certain operations to work when an incorrect password is supplied.
            if (m->check_is_encrypted || m->check_requires_password) {
                m->encryption_status = qpdf_es_encrypted | qpdf_es_password_incorrect;
                return nullptr;
            }
            if (m->show_encryption && pdf_sp) {
                m->log->info("Incorrect password supplied\n");
                showEncryption(*pdf_sp);
                return nullptr;
            }
        }
        throw;
    }
    QPDF& pdf = *pdf_sp;
    if (pdf.isEncrypted()) {
        m->encryption_status = qpdf_es_encrypted;
    }

    if (m->check_is_encrypted || m->check_requires_password) {
        return nullptr;
    }

    // If we are updating from JSON, this has to be done first before other options may cause
    // transformations to the input.
    if (!m->update_from_json.empty()) {
        pdf.updateFromJSON(m->update_from_json);
    }

    std::vector<std::unique_ptr<QPDF>> page_heap;
    if (!m->page_specs.empty()) {
        handlePageSpecs(pdf, page_heap);
    }
    if (!m->rotations.empty()) {
        handleRotations(pdf);
    }
    handleUnderOverlay(pdf);
    handleTransformations(pdf);
    if (m->remove_info) {
        auto trailer = pdf.getTrailer();
        auto mod_date = trailer.getKey("/Info").getKeyIfDict("/ModDate");
        if (mod_date.isNull()) {
            trailer.removeKey("/Info");
        } else {
            auto info = trailer.replaceKeyAndGetNew(
                "/Info", pdf.makeIndirectObject(QPDFObjectHandle::newDictionary()));
            info.replaceKey("/ModDate", mod_date);
        }
        pdf.getRoot().removeKey("/Metadata");
    }
    if (m->remove_metadata) {
        pdf.getRoot().removeKey("/Metadata");
    }
    if (m->remove_structure) {
        pdf.getRoot().removeKey("/StructTreeRoot");
        pdf.getRoot().removeKey("/MarkInfo");
    }

    for (auto& foreign: page_heap) {
        if (foreign->anyWarnings()) {
            m->warnings = true;
        }
    }
    return pdf_sp;
}